

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O2

void __thiscall
slang::ast::ASTVisitor<slang::ast::DriverVisitor,_true,_true,_false,_false>::
visit<slang::ast::DistExpression>
          (ASTVisitor<slang::ast::DriverVisitor,_true,_true,_false,_false> *this,DistExpression *t)

{
  bool bVar1;
  
  bVar1 = Expression::bad(&t->super_Expression);
  if (bVar1) {
    return;
  }
  DistExpression::visitExprs<slang::ast::DriverVisitor&>(t,(DriverVisitor *)this);
  return;
}

Assistant:

void visit(const T& t) {
        if constexpr (!VisitBad && requires { t.bad(); }) {
            if (t.bad())
                return;
        }

        if constexpr (requires { (DERIVED).handle(t); })
            (DERIVED).handle(t);
        else if constexpr (requires { (DERIVED)(DERIVED, t); })
            (DERIVED)(DERIVED, t);
        else
            visitDefault(t);
    }